

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays_test_generated.h
# Opt level: O0

void __thiscall
MyGame::Example::NestedStruct::NestedStruct
          (NestedStruct *this,span<const_int,_2UL> *_a,TestEnum _b,
          span<const_MyGame::Example::TestEnum,_2UL> *_c,span<const_long,_2UL> *_d)

{
  char cVar1;
  Array<int,_(unsigned_short)2> *this_00;
  Array<MyGame::Example::TestEnum,_(unsigned_short)2> *this_01;
  Array<long,_(unsigned_short)2> *this_02;
  span<const_long,_2UL> local_60;
  span<const_MyGame::Example::TestEnum,_2UL> local_50;
  span<const_int,_2UL> local_40;
  span<const_long,_2UL> *local_30;
  span<const_long,_2UL> *_d_local;
  span<const_MyGame::Example::TestEnum,_2UL> *_c_local;
  span<const_int,_2UL> *psStack_18;
  TestEnum _b_local;
  span<const_int,_2UL> *_a_local;
  NestedStruct *this_local;
  
  local_30 = _d;
  _d_local = (span<const_long,_2UL> *)_c;
  _c_local._7_1_ = _b;
  psStack_18 = _a;
  _a_local = (span<const_int,_2UL> *)this;
  cVar1 = flatbuffers::EndianScalar<signed_char>(_b);
  this->b_ = cVar1;
  this->padding0__ = '\0';
  this->padding1__ = 0;
  this_00 = flatbuffers::CastToArray<int,(unsigned_short)2>(this->a_);
  flatbuffers::span<const_int,_2UL>::span(&local_40,_a);
  flatbuffers::Array<int,_(unsigned_short)2>::CopyFromSpan(this_00,&local_40);
  this_01 = flatbuffers::CastToArrayOfEnum<MyGame::Example::TestEnum,signed_char,(unsigned_short)2>
                      (&this->c_);
  flatbuffers::span<const_MyGame::Example::TestEnum,_2UL>::span(&local_50,_c);
  flatbuffers::Array<MyGame::Example::TestEnum,_(unsigned_short)2>::CopyFromSpan(this_01,&local_50);
  this_02 = flatbuffers::CastToArray<long,(unsigned_short)2>((long (*) [2])this->d_);
  flatbuffers::span<const_long,_2UL>::span(&local_60,_d);
  flatbuffers::Array<long,_(unsigned_short)2>::CopyFromSpan(this_02,&local_60);
  return;
}

Assistant:

NestedStruct(::flatbuffers::span<const int32_t, 2> _a, MyGame::Example::TestEnum _b, ::flatbuffers::span<const MyGame::Example::TestEnum, 2> _c, ::flatbuffers::span<const int64_t, 2> _d)
      : b_(::flatbuffers::EndianScalar(static_cast<int8_t>(_b))),
        padding0__(0),
        padding1__(0) {
    ::flatbuffers::CastToArray(a_).CopyFromSpan(_a);
    ::flatbuffers::CastToArrayOfEnum<MyGame::Example::TestEnum>(c_).CopyFromSpan(_c);
    (void)padding0__;
    (void)padding1__;
    ::flatbuffers::CastToArray(d_).CopyFromSpan(_d);
  }